

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

void __thiscall
Js::JavascriptPromiseAllSettledResolveOrRejectElementFunction::ExtractSnapObjectDataInto
          (JavascriptPromiseAllSettledResolveOrRejectElementFunction *this,SnapObject *objData,
          SlabAllocator *alloc)

{
  uint dependsOnArrayCount;
  JavascriptPromiseCapability *this_00;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper **ppJVar1;
  JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper *pJVar2;
  JavascriptArray **ppJVar3;
  unsigned_long *dependsOnArray;
  Type *pTVar4;
  uint local_74;
  uint32 i;
  TTD_PTR_ID *depOnArray;
  uint32 depOnCount;
  undefined1 local_58 [8];
  List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> depOnList
  ;
  SnapPromiseAllResolveElementFunctionInfo *sprai;
  SlabAllocator *alloc_local;
  SnapObject *objData_local;
  JavascriptPromiseAllSettledResolveOrRejectElementFunction *this_local;
  
  depOnList._40_8_ =
       TTD::SlabAllocatorBase<0>::
       SlabAllocateStruct<TTD::NSSnapObjects::SnapPromiseAllResolveElementFunctionInfo>(alloc);
  JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  List((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
       local_58,&Memory::HeapAllocator::Instance,4);
  this_00 = Memory::WriteBarrierPtr<Js::JavascriptPromiseCapability>::operator->
                      (&(this->super_JavascriptPromiseAllResolveElementFunction).capabilities);
  JavascriptPromiseCapability::ExtractSnapPromiseCapabilityInto
            (this_00,(SnapPromiseCapabilityInfo *)depOnList._40_8_,
             (List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)local_58,alloc);
  *(Type *)(depOnList._40_8_ + 0x20) =
       (this->super_JavascriptPromiseAllResolveElementFunction).index;
  ppJVar1 = Memory::
            PointerValue<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>
                      (&(this->super_JavascriptPromiseAllResolveElementFunction).
                        remainingElementsWrapper);
  *(JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper **)(depOnList._40_8_ + 0x28)
       = *ppJVar1;
  pJVar2 = Memory::
           WriteBarrierPtr<Js::JavascriptPromiseAllResolveElementFunctionRemainingElementsWrapper>::
           operator->(&(this->super_JavascriptPromiseAllResolveElementFunction).
                       remainingElementsWrapper);
  *(Type *)(depOnList._40_8_ + 0x30) = pJVar2->remainingElements;
  ppJVar3 = Memory::PointerValue<Js::JavascriptArray>
                      (&(this->super_JavascriptPromiseAllResolveElementFunction).values);
  *(JavascriptArray **)(depOnList._40_8_ + 0x38) = *ppJVar3;
  JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  Add((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
      local_58,(unsigned_long *)(depOnList._40_8_ + 0x38));
  *(byte *)(depOnList._40_8_ + 0x40) =
       (this->super_JavascriptPromiseAllResolveElementFunction).alreadyCalled & 1;
  dependsOnArrayCount =
       JsUtil::ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer>::Count
                 ((ReadOnlyList<unsigned_long,_Memory::HeapAllocator,_DefaultComparer> *)local_58);
  dependsOnArray =
       TTD::SlabAllocatorBase<0>::SlabAllocateArray<unsigned_long>(alloc,(ulong)dependsOnArrayCount)
  ;
  for (local_74 = 0; local_74 < dependsOnArrayCount; local_74 = local_74 + 1) {
    pTVar4 = JsUtil::
             List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
             ::Item((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                     *)local_58,local_74);
    dependsOnArray[local_74] = *pTVar4;
  }
  TTD::NSSnapObjects::
  StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseAllResolveElementFunctionInfo*,(TTD::NSSnapObjects::SnapObjectType)31>
            (objData,(SnapPromiseAllResolveElementFunctionInfo *)depOnList._40_8_,alloc,
             dependsOnArrayCount,dependsOnArray);
  JsUtil::List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::
  ~List((List<unsigned_long,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *)
        local_58);
  return;
}

Assistant:

void JavascriptPromiseAllSettledResolveOrRejectElementFunction::ExtractSnapObjectDataInto(TTD::NSSnapObjects::SnapObject* objData, TTD::SlabAllocator& alloc)
    {
        TTD::NSSnapObjects::SnapPromiseAllResolveElementFunctionInfo* sprai = alloc.SlabAllocateStruct<TTD::NSSnapObjects::SnapPromiseAllResolveElementFunctionInfo>();

        JsUtil::List<TTD_PTR_ID, HeapAllocator> depOnList(&HeapAllocator::Instance);
        this->capabilities->ExtractSnapPromiseCapabilityInto(&sprai->Capabilities, depOnList, alloc);

        sprai->Index = this->index;
        sprai->RemainingElementsWrapperId = TTD_CONVERT_PROMISE_INFO_TO_PTR_ID(this->remainingElementsWrapper);
        sprai->RemainingElementsValue = this->remainingElementsWrapper->remainingElements;

        sprai->Values = TTD_CONVERT_VAR_TO_PTR_ID(this->values);
        depOnList.Add(sprai->Values);

        sprai->AlreadyCalled = this->alreadyCalled;

        uint32 depOnCount = depOnList.Count();
        TTD_PTR_ID* depOnArray = alloc.SlabAllocateArray<TTD_PTR_ID>(depOnCount);

        for (uint32 i = 0; i < depOnCount; ++i)
        {
            depOnArray[i] = depOnList.Item(i);
        }

        TTD::NSSnapObjects::StdExtractSetKindSpecificInfo<TTD::NSSnapObjects::SnapPromiseAllResolveElementFunctionInfo*, TTD::NSSnapObjects::SnapObjectType::SnapPromiseAllResolveElementFunctionObject>(objData, sprai, alloc, depOnCount, depOnArray);
    }